

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O1

void __thiscall pool_layer_t::activate(pool_layer_t *this)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  int _z;
  float fVar6;
  undefined1 auVar7 [64];
  uint local_5c;
  uint local_58;
  
  if (0 < (this->super_layer_t).out.size.x) {
    local_5c = 0;
    do {
      if (0 < (this->super_layer_t).out.size.y) {
        local_58 = 0;
        do {
          if (0 < (this->super_layer_t).out.size.z) {
            _z = 0;
            do {
              fVar6 = -3.4028235e+38;
              if (this->extend_filter != 0) {
                uVar1 = this->stride;
                uVar4 = 0;
                auVar7 = ZEXT464(0xff7fffff);
                do {
                  if (this->extend_filter != 0) {
                    uVar5 = 0;
                    do {
                      pfVar3 = tensor_t<float>::get
                                         (&(this->super_layer_t).in,
                                          uVar4 + (local_5c & 0xffff) * (uint)uVar1,
                                          uVar5 + (uint)uVar1 * (local_58 & 0xffff),_z);
                      auVar2 = vmaxss_avx(ZEXT416(auVar7._0_4_),ZEXT416((uint)*pfVar3));
                      auVar7 = ZEXT1664(auVar2);
                      uVar5 = uVar5 + 1;
                    } while (uVar5 < this->extend_filter);
                  }
                  fVar6 = auVar7._0_4_;
                  uVar4 = uVar4 + 1;
                } while (uVar4 < this->extend_filter);
              }
              pfVar3 = tensor_t<float>::get(&(this->super_layer_t).out,local_5c,local_58,_z);
              *pfVar3 = fVar6;
              _z = _z + 1;
            } while (_z < (this->super_layer_t).out.size.z);
          }
          local_58 = local_58 + 1;
        } while ((int)local_58 < (this->super_layer_t).out.size.y);
      }
      local_5c = local_5c + 1;
    } while ((int)local_5c < (this->super_layer_t).out.size.x);
  }
  return;
}

Assistant:

void activate() {
    for (int x = 0; x < out.size.x; x++) {
      for (int y = 0; y < out.size.y; y++) {
        for (int z = 0; z < out.size.z; z++) {
          point_t mapped = map_to_input({(uint16_t) x, (uint16_t) y, 0}, 0);
          float mval = -FLT_MAX;
          for (int i = 0; i < extend_filter; i++)
            for (int j = 0; j < extend_filter; j++) {
              float v = in(mapped.x + i, mapped.y + j, z);
              if (v > mval)
                mval = v;
            }
          out(x, y, z) = mval;
        }
      }
    }
  }